

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::pixie::SubscriptionSync::Summarize_abi_cxx11_
          (string *__return_storage_ptr__,SubscriptionSync *this)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  SubscriptionSync *local_18;
  SubscriptionSync *this_local;
  
  local_18 = this;
  this_local = (SubscriptionSync *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"SubscriptionSync(edition=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->edition_);
  std::operator<<(poVar2,", compressed=");
  bVar1 = IsCompressed(this);
  if (bVar1) {
    std::operator<<(local_190,"true");
  }
  else {
    std::operator<<(local_190,"false");
  }
  poVar2 = std::operator<<(local_190,", controls=");
  sVar3 = std::
          map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
          ::size(&this->controls_);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,", changed=");
  bVar1 = IsChangedEdition(this);
  if (bVar1) {
    std::operator<<(local_190,"true");
  }
  else {
    std::operator<<(local_190,"false");
  }
  poVar2 = std::operator<<(local_190,", subjects=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->size_);
  std::operator<<(poVar2,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string SubscriptionSync::Summarize()
{
    std::stringstream ss;
    ss << "SubscriptionSync(edition=" << edition_ <<
          ", compressed=";

    IsCompressed() ? ss << "true" : ss << "false";

    ss << ", controls=" << controls_.size() << ", changed=";

    IsChangedEdition() ? ss << "true" : ss << "false";

    ss << ", subjects=" << size_ << ")";

    return ss.str();
}